

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O2

void __thiscall
Guild_Create::Guild_Create
          (Guild_Create *this,GuildManager *manager,string *tag,string *name,Character *leader)

{
  string local_70;
  string local_50;
  
  (this->super_enable_shared_from_this<Guild_Create>)._M_weak_this.
  super___weak_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Guild_Create>)._M_weak_this.
  super___weak_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->members).
  super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members).
  super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members).
  super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util::uppercase(&local_50,tag);
  std::__cxx11::string::operator=((string *)tag,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->manager = manager;
  std::__cxx11::string::_M_assign((string *)&this->tag);
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->leader = leader;
  std::__cxx11::string::string((string *)&local_70,(string *)&leader->real_name);
  AddMember(this,&local_70,0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

Guild_Create::Guild_Create(GuildManager *manager, std::string tag, std::string name, Character *leader)
{
	tag = util::uppercase(tag);

	this->manager = manager;
	this->tag = tag;
	this->name = name;
	this->leader = leader;

	this->AddMember(leader->real_name, 0);
}